

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::widgets::select_base::selected_id(select_base *this,string *id)

{
  size_t __n;
  pointer peVar1;
  int iVar2;
  long lVar3;
  runtime_error *this_00;
  ulong uVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __n = id->_M_string_length;
  if (__n != 0) {
    peVar1 = (this->elements_).
             super__Vector_base<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(this->elements_).
                  super__Vector_base<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)peVar1;
    if (lVar3 != 0) {
      uVar4 = (lVar3 >> 4) * 0x4ec4ec4ec4ec4ec5;
      uVar5 = 0;
      do {
        if (__n == peVar1[uVar5].id._M_string_length) {
          iVar2 = bcmp((id->_M_dataplus)._M_p,peVar1[uVar5].id._M_dataplus._M_p,__n);
          if (iVar2 == 0) goto LAB_001f830b;
        }
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (uVar5 <= uVar4 && uVar4 - uVar5 != 0);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::operator+(&local_50,"Select base::invalid index: ",id);
    booster::runtime_error::runtime_error(this_00,&local_50);
    *(undefined ***)this_00 = &PTR__runtime_error_00284840;
    (this_00->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
    __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  uVar5 = 0xffffffff;
LAB_001f830b:
  this->selected_ = (int)uVar5;
  this->default_selected_ = (int)uVar5;
  return;
}

Assistant:

void select_base::selected_id(std::string id)
{
	if(id.empty()) {
		selected_ = -1;
		default_selected_ = -1;
		return;
	}
	for(unsigned i=0;i<elements_.size();i++) {
		if(id==elements_[i].id) {
			selected_ = i;
			default_selected_ = i;
			return;
		}
	}
	throw cppcms_error("Select base::invalid index: " + id);
}